

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::GetVertexAttribTest::checkVertexAttribLdv<4u>
          (GetVertexAttribTest *this,GLuint index,bool *result)

{
  GLuint index_00;
  bool bVar1;
  GLenum err;
  ostream *poVar2;
  char *pcVar3;
  string local_218 [32];
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  vertexAttribute<4U> vertex_attribute;
  GLuint i;
  stringstream local_1a8 [8];
  stringstream function_name;
  ostream local_198;
  bool *local_20;
  bool *result_local;
  GetVertexAttribTest *pGStack_10;
  GLuint index_local;
  GetVertexAttribTest *this_local;
  
  local_20 = result;
  result_local._4_4_ = index;
  pGStack_10 = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(&local_198,"VertexAttribL");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
  std::operator<<(poVar2,"dv");
  vertex_attribute.m_array[3]._0_4_ = 0;
  do {
    if (0x7f < vertex_attribute.m_array[3]._0_4_) {
LAB_010ceb97:
      std::__cxx11::stringstream::~stringstream(local_1a8);
      return;
    }
    vertexAttribute<4U>::vertexAttribute((vertexAttribute<4U> *)local_1d8,this->m_min,this->m_max);
    vertexAttribLdv<4u>(this,result_local._4_4_,(vertexAttribute<4U> *)local_1d8);
    err = (*(this->super_Base).gl.getError)();
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    glu::checkError(err,pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x31b);
    std::__cxx11::string::~string(local_1f8);
    index_00 = result_local._4_4_;
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = verifyResults(this,(GLdouble *)local_1d8,4,index_00,pcVar3,0x31d);
    std::__cxx11::string::~string(local_218);
    if (!bVar1) {
      *local_20 = false;
      goto LAB_010ceb97;
    }
    vertex_attribute.m_array[3]._0_4_ = vertex_attribute.m_array[3]._0_4_ + 1;
  } while( true );
}

Assistant:

void GetVertexAttribTest::checkVertexAttribLdv(GLuint index, bool& result) const
{
	std::stringstream function_name;

	function_name << "VertexAttribL" << SIZE << "dv";

	for (GLuint i = 0; i < m_n_iterations; ++i)
	{
		vertexAttribute<SIZE> vertex_attribute(m_min, m_max);

		vertexAttribLdv<SIZE>(index, vertex_attribute);
		GLU_EXPECT_NO_ERROR(gl.getError(), function_name.str().c_str());

		if (false == verifyResults(vertex_attribute.m_array, SIZE, index, function_name.str().c_str(), __LINE__))
		{
			result = false;
			return;
		}
	}
}